

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O0

trie trie_create_reserve(size_t capacity,size_t key_limit,size_t depth_limit,trie_cb_hash hash_cb,
                        trie_cb_compare compare_cb)

{
  trie_node ptVar1;
  trie_cb_hash in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  ulong in_RDI;
  trie_cb_compare in_R8;
  trie_node n;
  size_t iterator;
  trie t;
  size_t local_50;
  ulong local_40;
  trie local_8;
  
  if ((in_RCX == (trie_cb_hash)0x0) && (in_R8 == (trie_cb_compare)0x0)) {
    log_write_impl_va("metacall",0x96,"trie_create_reserve",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                      ,LOG_LEVEL_ERROR,"Trie invalid callback");
    local_8 = (trie)0x0;
  }
  else {
    local_8 = (trie)malloc(0x48);
    if (local_8 == (trie)0x0) {
      log_write_impl_va("metacall",0x9f,"trie_create_reserve",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                        ,LOG_LEVEL_ERROR,"Trie bad allocation");
      local_8 = (trie)0x0;
    }
    else {
      local_8->size = 1;
      local_50 = in_RDI;
      if (in_RDI < 0x10) {
        local_50 = 0x10;
      }
      local_8->capacity = local_50;
      local_8->key_limit = in_RSI;
      local_8->depth_limit = in_RDX;
      local_8->hash_cb = in_RCX;
      local_8->compare_cb = in_R8;
      ptVar1 = (trie_node)malloc(local_8->capacity * 0x28);
      local_8->node_list = ptVar1;
      if (local_8->node_list == (trie_node)0x0) {
        log_write_impl_va("metacall",0xaf,"trie_create_reserve",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                          ,LOG_LEVEL_ERROR,"Trie bad node list creation");
        free(local_8);
        local_8 = (trie)0x0;
      }
      else {
        for (local_40 = 0; local_40 < local_8->capacity; local_40 = local_40 + 1) {
          ptVar1 = local_8->node_list + local_40;
          ptVar1->parent_index = 0;
          ptVar1->self_index = 0;
          ptVar1->key = (trie_key)0x0;
          ptVar1->value = (trie_value)0x0;
          ptVar1->childs = (set)0x0;
        }
        local_8->root = local_8->node_list;
        local_8->free_node_list = (trie_node_free_conflict)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

trie trie_create_reserve(size_t capacity, size_t key_limit, size_t depth_limit, trie_cb_hash hash_cb, trie_cb_compare compare_cb)
{
	trie t;

	size_t iterator;

	if (hash_cb == NULL && compare_cb == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid callback");

		return NULL;
	}

	t = malloc(sizeof(struct trie_type));

	if (t == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Trie bad allocation");

		return NULL;
	}

	t->size = 1;
	t->capacity = (capacity < TRIE_CAPACITY_MIN) ? TRIE_CAPACITY_MIN : capacity;
	t->key_limit = key_limit;
	t->depth_limit = depth_limit;
	t->hash_cb = hash_cb;
	t->compare_cb = compare_cb;

	t->node_list = malloc(t->capacity * sizeof(struct trie_node_type));

	if (t->node_list == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Trie bad node list creation");

		free(t);

		return NULL;
	}

	for (iterator = 0; iterator < t->capacity; ++iterator)
	{
		trie_node n = &t->node_list[iterator];

		n->parent_index = 0;
		n->self_index = 0;
		n->key = NULL;
		n->value = NULL;
		n->childs = NULL;
	}

	t->root = &t->node_list[0];

	t->free_node_list = NULL;

	return t;
}